

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O3

CanFocus Rml::anon_unknown_0::CanFocusElement(Element *element)

{
  bool bVar1;
  ComputedValues *pCVar2;
  CanFocus CVar3;
  
  bVar1 = Element::IsVisible(element,false);
  CVar3 = NoAndNoChildren;
  if (bVar1) {
    pCVar2 = Element::GetComputedValues(element);
    if (((pCVar2->inherited).field_0x15 & 0x40) != 0) {
      CVar3 = (CanFocus)(((pCVar2->rare).field_0x2 & 0x80) == 0);
    }
  }
  return CVar3;
}

Assistant:

CanFocus CanFocusElement(Element* element)
	{
		if (!element->IsVisible())
			return CanFocus::NoAndNoChildren;

		const ComputedValues& computed = element->GetComputedValues();

		if (computed.focus() == Style::Focus::None)
			return CanFocus::NoAndNoChildren;

		if (computed.tab_index() == Style::TabIndex::Auto)
			return CanFocus::Yes;

		return CanFocus::No;
	}